

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O2

bool __thiscall QNetworkCookieJar::insertCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QDateTime now;
  QDateTime local_40 [8];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  bVar2 = QNetworkCookie::isSessionCookie(cookie);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    QNetworkCookie::expirationDate((QNetworkCookie *)local_40);
    bVar2 = operator<(local_40,(QDateTime *)&local_38);
    QDateTime::~QDateTime(local_40);
  }
  (**(code **)(*(long *)this + 0x80))(this,cookie);
  if (bVar2 == false) {
    QList<QNetworkCookie>::emplaceBack<QNetworkCookie_const&>
              ((QList<QNetworkCookie> *)(lVar1 + 0x78),cookie);
  }
  QDateTime::~QDateTime((QDateTime *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(bVar2 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookieJar::insertCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    bool isDeletion = !cookie.isSessionCookie() &&
                      cookie.expirationDate() < now;

    deleteCookie(cookie);

    if (!isDeletion) {
        d->allCookies += cookie;
        return true;
    }
    return false;
}